

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

shared_ptr<Assimp::FIIntValue> __thiscall
Assimp::FIIntValue::create(FIIntValue *this,vector<int,_std::allocator<int>_> *value)

{
  pointer piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pointer piVar2;
  shared_ptr<Assimp::FIIntValue> sVar3;
  
  piVar2 = (pointer)operator_new(0x58);
  piVar2[2] = 1;
  piVar2[3] = 1;
  *(undefined ***)piVar2 = &PTR___Sp_counted_ptr_inplace_008c0238;
  *(undefined ***)(piVar2 + 4) = &PTR_toString_abi_cxx11__008c0288;
  *(pointer *)(piVar2 + 0xc) = piVar2 + 0x10;
  piVar2[0xe] = 0;
  piVar2[0xf] = 0;
  *(undefined1 *)(piVar2 + 0x10) = 0;
  *(undefined1 *)(piVar2 + 0x14) = 0;
  piVar1 = (value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  *(pointer *)(piVar2 + 6) =
       (value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  *(pointer *)(piVar2 + 8) = piVar1;
  *(pointer *)(piVar2 + 10) =
       (value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->super_FIValue)._vptr_FIValue = (_func_int **)(piVar2 + 4);
  (this->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = piVar2;
  sVar3.super___shared_ptr<Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sVar3.super___shared_ptr<Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Assimp::FIIntValue>)
         sVar3.super___shared_ptr<Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FIIntValue> FIIntValue::create(std::vector<int32_t> &&value) {
    return std::make_shared<FIIntValueImpl>(std::move(value));
}